

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall crnlib::dxt_hc::~dxt_hc(dxt_hc *this)

{
  vector<unsigned_long_long> *local_18;
  dxt_hc *this_local;
  
  vector<crnlib::dxt_hc::alpha_cluster>::~vector(&this->m_alpha_clusters);
  vector<crnlib::dxt_hc::color_cluster>::~vector(&this->m_color_clusters);
  vector<crnlib::dxt_hc::selector_indices_details>::~vector(&this->m_selector_indices);
  vector<crnlib::dxt_hc::endpoint_indices_details>::~vector(&this->m_endpoint_indices);
  vector<unsigned_int>::~vector(&this->m_tile_indices);
  vector<bool>::~vector(&this->m_alpha_selectors_used);
  vector<bool>::~vector(&this->m_color_selectors_used);
  vector<unsigned_long_long>::~vector(&this->m_alpha_selectors);
  vector<unsigned_int>::~vector(&this->m_color_selectors);
  local_18 = (vector<unsigned_long_long> *)&this->m_color_selectors;
  do {
    local_18 = local_18 + -1;
    vector<unsigned_long_long>::~vector(local_18);
  } while (local_18 != this->m_block_selectors);
  vector<unsigned_char>::~vector(&this->m_block_encodings);
  vector<float>::~vector(&this->m_block_weights);
  vector<crnlib::dxt_hc::tile_details>::~vector(&this->m_tiles);
  return;
}

Assistant:

dxt_hc::~dxt_hc()
    {
    }